

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O3

void __thiscall QDataStream::abortTransaction(QDataStream *this)

{
  quint16 qVar1;
  
  this->q_status = '\x02';
  if (this->transactionDepth == 0) {
    abortTransaction();
    return;
  }
  qVar1 = this->transactionDepth - 1;
  this->transactionDepth = qVar1;
  if ((qVar1 == 0) && (this->dev != (QIODevice *)0x0)) {
    QIODevice::commitTransaction(this->dev);
    return;
  }
  return;
}

Assistant:

void QDataStream::abortTransaction()
{
    q_status = ReadCorruptData;

    CHECK_STREAM_TRANSACTION_PRECOND(Q_VOID)
    if (--transactionDepth != 0)
        return;

    CHECK_STREAM_PRECOND(Q_VOID)
    dev->commitTransaction();
}